

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O1

spv_result_t spvtools::anon_unknown_6::advance(spv_text text,spv_position position)

{
  size_t *psVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  size_t sVar7;
  spv_result_t sVar8;
  spv_position psVar9;
  
  uVar4 = text->length;
  sVar7 = position->index;
  psVar1 = &position->column;
LAB_005f662b:
  if (uVar4 <= sVar7) {
    return SPV_END_OF_STREAM;
  }
  pcVar5 = text->str;
  do {
    bVar2 = pcVar5[sVar7];
    psVar9 = (spv_position)psVar1;
    if (bVar2 < 0xd) {
      if (bVar2 != 9) {
        if (bVar2 != 10) {
          if (bVar2 != 0) {
            return SPV_SUCCESS;
          }
          return SPV_END_OF_STREAM;
        }
        position->column = 0;
        psVar9 = position;
      }
    }
    else if ((bVar2 != 0xd) && (bVar2 != 0x20)) break;
    psVar9->line = psVar9->line + 1;
    sVar7 = sVar7 + 1;
    position->index = sVar7;
    if (uVar4 == sVar7) {
      return SPV_END_OF_STREAM;
    }
  } while( true );
  if (bVar2 != 0x3b) {
    return SPV_SUCCESS;
  }
  do {
    cVar3 = pcVar5[sVar7];
    if (cVar3 == '\0') {
      sVar8 = SPV_END_OF_STREAM;
      bVar6 = true;
      goto LAB_005f66d9;
    }
    if (cVar3 == '\n') {
      position->column = 0;
      position->line = position->line + 1;
      sVar7 = sVar7 + 1;
      position->index = sVar7;
      bVar6 = false;
      sVar8 = SPV_SUCCESS;
      goto LAB_005f66d9;
    }
    position->column = position->column + 1;
    sVar7 = sVar7 + 1;
    position->index = sVar7;
  } while (uVar4 != sVar7);
  sVar8 = SPV_END_OF_STREAM;
  bVar6 = true;
  sVar7 = uVar4;
LAB_005f66d9:
  if (bVar6) {
    return sVar8;
  }
  goto LAB_005f662b;
}

Assistant:

spv_result_t advance(spv_text text, spv_position position) {
  // NOTE: Consume white space, otherwise don't advance.
  while (true) {
    if (position->index >= text->length) return SPV_END_OF_STREAM;
    switch (text->str[position->index]) {
      case '\0':
        return SPV_END_OF_STREAM;
      case ';':
        if (spv_result_t error = advanceLine(text, position)) return error;
        continue;
      case ' ':
      case '\t':
      case '\r':
        position->column++;
        position->index++;
        continue;
      case '\n':
        position->column = 0;
        position->line++;
        position->index++;
        continue;
      default:
        return SPV_SUCCESS;
    }
  }
}